

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O1

bool __thiscall Dependency::mergeIfSameAs(Dependency *this,Dependency *dep2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pbVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  string local_50;
  
  paVar1 = &local_50.field_2;
  pcVar2 = (dep2->filename)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (dep2->filename)._M_string_length);
  iVar5 = std::__cxx11::string::compare((string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((iVar5 == 0) &&
     (uVar7 = (uint)((ulong)((long)(this->symlinks).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->symlinks).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5), 0 < (int)uVar7))
  {
    uVar8 = (ulong)(uVar7 & 0x7fffffff);
    lVar6 = 8;
    do {
      pbVar3 = (this->symlinks).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = *(long *)((long)pbVar3 + lVar6 + -8);
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,lVar4,
                 *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar6) + lVar4);
      addSymlink(dep2,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      lVar6 = lVar6 + 0x20;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return iVar5 == 0;
}

Assistant:

bool Dependency::mergeIfSameAs(Dependency& dep2)
{
    if(dep2.getOriginalFileName().compare(filename) == 0)
    {
        const int samount = getSymlinkAmount();
        for(int n=0; n<samount; n++) {
            dep2.addSymlink(getSymlink(n));
        }
        return true;
    }
    return false;
}